

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

iterator __thiscall
fmt::v8::detail::default_arg_formatter<char32_t>::operator()
          (default_arg_formatter<char32_t> *this,void *value)

{
  back_insert_iterator<fmt::v8::detail::buffer<char32_t>_> bVar1;
  basic_format_specs<char32_t> local_20;
  
  local_20.width = 0;
  local_20.precision = -1;
  local_20.type = none;
  local_20._9_2_ = 0;
  local_20.fill.data_[0] = L' ';
  local_20.fill.data_[1] = L'\0';
  local_20.fill.data_[2] = L'\0';
  local_20.fill.data_[3] = L'\0';
  local_20.fill.size_ = '\x01';
  bVar1 = write<char32_t,_std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>,_void,_0>
                    ((this->out).container,value,&local_20,(locale_ref)0x0);
  return (iterator)bVar1.container;
}

Assistant:

auto operator()(T value) -> iterator {
    return write<Char>(out, value);
  }